

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

Expectation __thiscall
testing::internal::UntypedFunctionMockerBase::GetHandleOf
          (UntypedFunctionMockerBase *this,ExpectationBase *exp)

{
  element_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Expectation EVar3;
  allocator local_31;
  string local_30;
  
  p_Var2 = *(__shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2> **)
            ((long)&(exp->source_text_).field_2 + 8);
  do {
    if (p_Var2 == *(__shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2> **)
                   &exp->cardinality_specified_) {
      std::__cxx11::string::string((string *)&local_30,"Cannot find expectation.",&local_31);
      Assert(false,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/third_party/googletest/googlemock/src/gmock-spec-builders.cc"
             ,500,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      this->_vptr_UntypedFunctionMockerBase = (_func_int **)0x0;
      this->mock_obj_ = (void *)0x0;
      _Var1._M_pi = extraout_RDX;
LAB_001294a0:
      EVar3.expectation_base_.
      super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = _Var1._M_pi;
      EVar3.expectation_base_.
      super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (Expectation)
             EVar3.expectation_base_.
             super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>;
    }
    if (p_Var2->_M_ptr == in_RDX) {
      std::__shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2> *)
                   this,p_Var2);
      _Var1._M_pi = extraout_RDX_00;
      goto LAB_001294a0;
    }
    p_Var2 = p_Var2 + 1;
  } while( true );
}

Assistant:

Expectation UntypedFunctionMockerBase::GetHandleOf(ExpectationBase* exp) {
  // See the definition of untyped_expectations_ for why access to it
  // is unprotected here.
  for (UntypedExpectations::const_iterator it =
           untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    if (it->get() == exp) {
      return Expectation(*it);
    }
  }

  Assert(false, __FILE__, __LINE__, "Cannot find expectation.");
  return Expectation();
  // The above statement is just to make the code compile, and will
  // never be executed.
}